

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_helpers.h
# Opt level: O2

void highwayhash::UpdateState<highwayhash::SipHashStateT<2,4>>
               (char *bytes,HH_U64 size,SipHashStateT<2,_4> *state)

{
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (size & 0xfffffffffffffff8); uVar1 = uVar1 + 8) {
    SipHashStateT<2,_4>::Update(state,bytes + uVar1);
  }
  PaddedUpdate<highwayhash::SipHashStateT<2,4>>
            (size,bytes + (size & 0xfffffffffffffff8),(ulong)((uint)size & 7),state);
  return;
}

Assistant:

HH_INLINE void UpdateState(const char* bytes, const HH_U64 size, State* state) {
  // Feed entire packets.
  const int kPacketSize = State::kPacketSize;
  static_assert((kPacketSize & (kPacketSize - 1)) == 0, "Size must be 2^i.");
  const size_t remainder = size & (kPacketSize - 1);
  const size_t truncated_size = size - remainder;
  for (size_t i = 0; i < truncated_size; i += kPacketSize) {
    state->Update(bytes + i);
  }

  PaddedUpdate(size, bytes + truncated_size, remainder, state);
}